

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O3

bool QtGuiTest::synthesizeKeyEvent
               (QWindow *window,Type t,int k,KeyboardModifiers mods,QString *text,bool autorep,
               ushort count)

{
  QDebug QVar1;
  bool bVar2;
  char16_t *pcVar3;
  QMetaObject *obj;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcQtGuiTest();
  if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    QVar1.stream = local_70.stream;
    QVar4.m_data = (storage_type *)0x17;
    QVar4.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<(&(QVar1.stream)->ts,(QString *)local_50);
    if (local_50[0].stream != (Stream *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if ((local_70.stream)->space == true) {
      QTextStream::operator<<(&(local_70.stream)->ts,' ');
    }
    local_68.stream = local_70.stream;
    (local_70.stream)->ref = (local_70.stream)->ref + 1;
    qt_QMetaEnum_debugOperator
              ((QDebug *)&local_60,(longlong)&local_68,(QMetaObject *)(ulong)t,
               (char *)&QEvent::staticMetaObject);
    qt_QMetaEnum_debugOperator
              ((QDebug *)&local_58,(longlong)&local_60,(QMetaObject *)(ulong)(uint)k,
               (char *)&Qt::staticMetaObject);
    qt_QMetaEnum_flagDebugOperator
              ((QDebug *)local_50,(ulonglong)&local_58,
               (QMetaObject *)
               (ulong)(uint)mods.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                            super_QFlagsStorage<Qt::KeyboardModifier>.i,
               (char *)&Qt::staticMetaObject);
    pcVar3 = (text->d).ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)local_50,(ulong)pcVar3);
    if ((local_50[0].stream)->space == true) {
      QTextStream::operator<<(&(local_50[0].stream)->ts,' ');
    }
    QDebug::~QDebug(local_50);
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug(&local_68);
    QDebug::~QDebug(&local_70);
  }
  bVar2 = QWindowSystemInterface::handleKeyEvent<QWindowSystemInterface::DefaultDelivery>
                    (window,t,k,mods,text,autorep,count);
  if (bVar2) {
    QCoreApplication::sendPostedEvents((QObject *)0x0,0);
    lcQtGuiTest();
    if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) == 0)
    goto LAB_0031ae25;
    QMessageLogger::debug();
  }
  else {
    lcQtGuiTest();
    if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) == 0)
    goto LAB_0031ae25;
    QMessageLogger::debug();
  }
  QVar1.stream = local_70.stream;
  QVar5.m_data = (storage_type *)0x9;
  QVar5.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<(&(QVar1.stream)->ts,(QString *)local_50);
  if (local_50[0].stream != (Stream *)0x0) {
    LOCK();
    *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
    UNLOCK();
    if (*(int *)local_50[0].stream == 0) {
      QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
    }
  }
  if ((local_70.stream)->space == true) {
    QTextStream::operator<<(&(local_70.stream)->ts,' ');
  }
  QDebug::~QDebug(&local_70);
LAB_0031ae25:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QtGuiTest::synthesizeKeyEvent(QWindow *window, QEvent::Type t, int k, Qt::KeyboardModifiers mods,
                                          const QString & text, bool autorep,
                                          ushort count)
{
    Q_ASSERT_X((t == QEvent::KeyPress
                || t == QEvent::KeyRelease),
               Q_FUNC_INFO,
               "called with invalid QEvent type");

    deb << "Synthesizing key event:" << t << Qt::Key(k) << mods << text;

    bool result = QWindowSystemInterface::handleKeyEvent(window, t, k, mods, text, autorep, count);
    if (result) {
        // If the key event is a shortcut, it may cause other events to be posted.
        // => process those.
        QCoreApplication::sendPostedEvents();
        deb << "(success)";
    } else {
        deb << "(failure)";
    }

    return result;
}